

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void freeIndexInfo(sqlite3 *db,sqlite3_index_info *pIdxInfo)

{
  long lVar1;
  
  if (0 < pIdxInfo->nConstraint) {
    lVar1 = 0;
    do {
      sqlite3ValueFree((sqlite3_value *)(&pIdxInfo[1].aConstraintUsage)[lVar1]);
      (&pIdxInfo[1].aConstraintUsage)[lVar1] = (sqlite3_index_constraint_usage *)0x0;
      lVar1 = lVar1 + 1;
    } while (lVar1 < pIdxInfo->nConstraint);
  }
  if (pIdxInfo->needToFreeIdxStr != 0) {
    sqlite3_free(pIdxInfo->idxStr);
    pIdxInfo->idxStr = (char *)0x0;
    pIdxInfo->needToFreeIdxStr = 0;
  }
  sqlite3DbFreeNN(db,pIdxInfo);
  return;
}

Assistant:

static void freeIndexInfo(sqlite3 *db, sqlite3_index_info *pIdxInfo){
  HiddenIndexInfo *pHidden;
  int i;
  assert( pIdxInfo!=0 );
  pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  assert( pHidden->pParse!=0 );
  assert( pHidden->pParse->db==db );
  for(i=0; i<pIdxInfo->nConstraint; i++){
    sqlite3ValueFree(pHidden->aRhs[i]); /* IMP: R-14553-25174 */
    pHidden->aRhs[i] = 0;
  }
  freeIdxStr(pIdxInfo);
  sqlite3DbFree(db, pIdxInfo);
}